

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void discrete_dist_test_streamable<trng::poisson_dist>(poisson_dist *d)

{
  StringRef capturedExpression;
  ExprLhs<const_trng::poisson_dist_&> this;
  poisson_dist *in_RDI;
  AssertionHandler catchAssertionHandler;
  poisson_dist d_new;
  stringstream str;
  param_type p_new;
  undefined4 in_stack_fffffffffffffd48;
  Flags in_stack_fffffffffffffd4c;
  SourceLineInfo *in_stack_fffffffffffffd50;
  SourceLineInfo *this_00;
  AssertionHandler *this_01;
  param_type *in_stack_fffffffffffffd68;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffd70;
  poisson_dist *in_stack_fffffffffffffd80;
  param_type *in_stack_fffffffffffffd88;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffd90;
  SourceLineInfo local_248;
  StringRef local_238;
  stringstream local_1b0 [16];
  AssertionHandler local_1a0 [5];
  poisson_dist *local_8;
  
  local_8 = in_RDI;
  trng::poisson_dist::param_type::param_type((param_type *)0x390bcc);
  std::__cxx11::stringstream::stringstream(local_1b0);
  this_01 = local_1a0;
  trng::poisson_dist::param(local_8);
  trng::operator<<(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  trng::operator>>(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  trng::poisson_dist::poisson_dist
            ((poisson_dist *)in_stack_fffffffffffffd50,
             (param_type *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  local_238 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffd50,
                         CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  this_00 = &local_248;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0x127);
  Catch::StringRef::StringRef((StringRef *)this_01,(char *)this_00);
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffd70;
  capturedExpression.m_start = (char *)in_stack_fffffffffffffd68;
  Catch::AssertionHandler::AssertionHandler
            (this_01,(StringRef *)this_00,in_stack_fffffffffffffd50,capturedExpression,
             in_stack_fffffffffffffd4c);
  this = Catch::Decomposer::operator<=
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                    (poisson_dist *)0x390cbf);
  Catch::ExprLhs<trng::poisson_dist_const&>::operator==
            ((ExprLhs<const_trng::poisson_dist_&> *)in_stack_fffffffffffffd88,
             in_stack_fffffffffffffd80);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)this.m_lhs,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  Catch::BinaryExpr<const_trng::poisson_dist_&,_const_trng::poisson_dist_&>::~BinaryExpr
            ((BinaryExpr<const_trng::poisson_dist_&,_const_trng::poisson_dist_&> *)0x390d07);
  Catch::AssertionHandler::complete((AssertionHandler *)this.m_lhs);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)this.m_lhs);
  trng::poisson_dist::~poisson_dist((poisson_dist *)0x390ddb);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  trng::poisson_dist::param_type::~param_type((param_type *)0x390df5);
  return;
}

Assistant:

void discrete_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE(d == d_new);
}